

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetBuilder.h
# Opt level: O3

void __thiscall Refal2::CSetBuilder<int>::ExcludeAllExcept(CSetBuilder<int> *this,CSet *elements)

{
  CSet tmp;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_40;
  
  if (this->fullSetStatus == S_Yes) {
    std::
    __set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((this->thru)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               &(this->thru)._M_t._M_impl.super__Rb_tree_header,
               (elements->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
               &(elements->_M_t)._M_impl.super__Rb_tree_header,&this->no,
               &(this->no)._M_t._M_impl.super__Rb_tree_header);
  }
  else if (this->fullSetStatus == S_Thru) {
    this->fullSetStatus = S_No;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
              (&(this->thru)._M_t,&elements->_M_t);
    return;
  }
  local_40._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_40._M_impl.super__Rb_tree_header._M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right =
       local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->thru)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(this->thru)._M_t._M_impl.super__Rb_tree_header,
             (elements->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             &(elements->_M_t)._M_impl.super__Rb_tree_header,&local_40);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&(this->thru)._M_t,&local_40);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_40);
  return;
}

Assistant:

void CSetBuilder<T>::ExcludeAllExcept(const CSet& elements)
{
	/*
	IF full_set_status == S_thru THEN
		full_set_status = S_no
		THRU = elements
	ELSE IF full_set_status == S_yes THEN
		NO = NO + (THRU - elements)
		THRU = THRU * elements
	ELSE IF full_set_status == S_no THEN
		THRU = THRU * elements
	*/
	if( fullSetStatus == S_Thru ) {
		fullSetStatus = S_No;
		thru = elements;
	} else {
		if( fullSetStatus == S_Yes ) {
			std::set_difference( thru.begin(), thru.end(), elements.begin(),
				elements.end(), std::inserter( no, no.end() ) );
		}
		CSet tmp;
		std::set_intersection( thru.begin(), thru.end(), elements.begin(),
			elements.end(), std::inserter( tmp, tmp.end() ) );
		thru = tmp;
	}
}